

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O2

void __thiscall
TPZMatrix<int>::SolveJacobi
          (TPZMatrix<int> *this,int64_t *numiterations,TPZFMatrix<int> *F,TPZFMatrix<int> *result,
          TPZFMatrix<int> *residual,TPZFMatrix<int> *scratch,REAL *tol,int FromCurrent)

{
  int iVar1;
  int iVar2;
  int extraout_var;
  long lVar3;
  int *piVar4;
  long lVar5;
  long lVar6;
  int64_t i;
  long row;
  int64_t ic;
  long col;
  
  if (FromCurrent == 0) {
    TPZFMatrix<int>::operator=(scratch,F);
    (*(result->super_TPZMatrix<int>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xf])
              (result);
  }
  else {
    (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x28])(this,result,F,scratch);
  }
  iVar1 = Norm(scratch);
  iVar2 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])(this);
  lVar5 = (F->super_TPZMatrix<int>).super_TPZBaseMatrix.fCol;
  lVar6 = 0;
  lVar3 = CONCAT44(extraout_var,iVar2);
  if (CONCAT44(extraout_var,iVar2) == 0 || extraout_var < 0) {
    lVar3 = lVar6;
  }
  if (lVar5 < 1) {
    lVar5 = lVar6;
  }
  while ((lVar6 < *numiterations && (*tol <= ABS((double)iVar1) && ABS((double)iVar1) != *tol))) {
    for (col = 0; col != lVar5; col = col + 1) {
      for (row = 0; lVar3 != row; row = row + 1) {
        piVar4 = TPZFMatrix<int>::operator()(scratch,row,col);
        iVar2 = *piVar4;
        iVar1 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,row,row)
        ;
        piVar4 = TPZFMatrix<int>::operator()(result,row,col);
        *piVar4 = *piVar4 + iVar2 / iVar1;
      }
    }
    (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x28])(this,result,F,scratch);
    iVar1 = Norm(scratch);
    lVar6 = lVar6 + 1;
  }
  if (residual == (TPZFMatrix<int> *)0x0) {
    return;
  }
  TPZFMatrix<int>::operator=(residual,scratch);
  return;
}

Assistant:

void TPZMatrix<TVar>::SolveJacobi(int64_t &numiterations,const TPZFMatrix<TVar> &F, TPZFMatrix<TVar> &result,
								  TPZFMatrix<TVar> *residual, TPZFMatrix<TVar> &scratch, REAL &tol,const int FromCurrent) {
	
	
	if(FromCurrent) {
		Residual(result,F,scratch);
	} else {
		scratch = F;
		result.Zero();
	}
	REAL res;
	res = TPZExtractVal::val(Norm(scratch));
	int64_t r = Dim();
	int64_t c = F.Cols();
	for(int64_t it=0; it<numiterations && (fabs(res)) > tol; it++) {
		for(int64_t ic=0; ic<c; ic++) {
			for(int64_t i=0; i<r; i++) {
				result(i,ic) += (scratch)(i,ic)/GetVal(i,i);
			}
		}
		Residual(result,F,scratch);
		res = TPZExtractVal::val(Norm(scratch));
	}
	if(residual) *residual = scratch;
}